

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

ScriptWitness * __thiscall
cfd::core::ConfidentialTransaction::AddPeginWitnessStack
          (ScriptWitness *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *this_00;
  void *pvVar1;
  long lVar2;
  pointer puVar3;
  pointer pCVar4;
  long lVar5;
  CfdException *this_01;
  pointer puVar6;
  ulong uVar7;
  int ret;
  wally_tx_witness_stack *stack_pointer;
  string function_name;
  int local_84;
  long local_80;
  undefined1 local_78 [16];
  char local_68 [16];
  undefined1 local_58 [32];
  long local_38;
  
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x6a8,"AddPeginWitnessStack");
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  uVar7 = (ulong)tx_in_index;
  if (uVar7 < *(ulong *)((long)pvVar1 + 0x10)) {
    local_84 = 0;
    local_80 = 0;
    local_78._0_8_ = local_68;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"wally_tx_witness_stack_init_alloc","");
    local_38 = uVar7 * 0xd0;
    lVar2 = *(long *)(*(long *)((long)pvVar1 + 8) + 200 + local_38);
    lVar5 = lVar2;
    if (lVar2 == 0) {
      local_84 = wally_tx_witness_stack_init_alloc(1);
      lVar5 = local_80;
    }
    local_80 = lVar5;
    if (local_84 == 0) {
      ::std::__cxx11::string::_M_replace((ulong)local_78,0,(char *)local_78._8_8_,0x21c7b7);
      puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish + -(long)puVar3;
      if (puVar6 == (pointer)0x0) {
        puVar6 = (pointer)0x0;
        puVar3 = (pointer)0x0;
      }
      local_84 = wally_tx_witness_stack_add(local_80,puVar3,puVar6);
      if ((lVar2 == 0) && (local_84 == 0)) {
        *(long *)(*(long *)((long)pvVar1 + 8) + 200 + local_38) = local_80;
        local_80 = 0;
      }
      if (local_80 != 0 && lVar2 == 0) {
        wally_tx_witness_stack_free();
      }
    }
    if (local_84 != 0) {
      local_58._0_8_ = "cfdcore_elements_transaction.cpp";
      local_58._8_4_ = 0x6d5;
      local_58._16_8_ = "AddPeginWitnessStack";
      logger::log<std::__cxx11::string&,int&>
                ((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"{} NG[{}].",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &local_84);
      this_01 = (CfdException *)__cxa_allocate_exception(0x30);
      local_58._0_8_ = local_58 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"witness stack error.","");
      CfdException::CfdException(this_01,kCfdIllegalStateError,(string *)local_58);
      __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((char *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_);
    }
  }
  SetElementsTxState(this);
  pCVar4 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ByteData::ByteData((ByteData *)local_58,data);
  ScriptWitness::AddWitnessStack(&pCVar4[uVar7].pegin_witness_,(ByteData *)local_58);
  this_00 = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)(local_78 + 8);
  local_78._0_8_ = &PTR__ScriptWitness_0025acc0;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (this_00,&pCVar4[uVar7].pegin_witness_.witness_stack_);
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_);
  }
  __return_storage_ptr__->_vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0025acc0;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&__return_storage_ptr__->witness_stack_,this_00);
  local_78._0_8_ = &PTR__ScriptWitness_0025acc0;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(this_00);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness ConfidentialTransaction::AddPeginWitnessStack(
    uint32_t tx_in_index, const std::vector<uint8_t> &data) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    int ret = WALLY_OK;
    bool is_alloc = false;
    struct wally_tx_witness_stack *stack_pointer = NULL;

    std::string function_name = "wally_tx_witness_stack_init_alloc";
    if (tx_pointer->inputs[tx_in_index].pegin_witness == NULL) {
      is_alloc = true;
      ret = wally_tx_witness_stack_init_alloc(1, &stack_pointer);
    } else {
      stack_pointer = tx_pointer->inputs[tx_in_index].pegin_witness;
    }

    if (ret == WALLY_OK) {
      try {
        // append witness stack
        function_name = "wally_tx_witness_stack_add";
        if (data.empty()) {
          ret = wally_tx_witness_stack_add(stack_pointer, NULL, 0);
        } else {
          ret = wally_tx_witness_stack_add(
              stack_pointer, data.data(), data.size());
        }

        // append tx input
        if (is_alloc && (ret == WALLY_OK)) {
          tx_pointer->inputs[tx_in_index].pegin_witness = stack_pointer;
          stack_pointer = nullptr;
        }
      } catch (...) {
        // internal error.
        warn(CFD_LOG_SOURCE, "system error.");
        ret = WALLY_ERROR;
      }

      if (is_alloc && stack_pointer) {
        wally_tx_witness_stack_free(stack_pointer);
      }
    }

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "{} NG[{}].", function_name, ret);
      throw CfdException(kCfdIllegalStateError, "witness stack error.");
    }
  }
  SetElementsTxState();

  const ScriptWitness &witness =
      vin_[tx_in_index].AddPeginWitnessStack(ByteData(data));
  return witness;
}